

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

void Js::DynamicProfileInfo::UpdateSourceDynamicProfileManagers(ScriptContext *scriptContext)

{
  NodeBase **addr;
  SListNodeBase<Memory::Recycler> *pSVar1;
  SourceDynamicProfileManager *this;
  code *pcVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  FunctionBody *this_00;
  SourceContextInfo *pSVar7;
  undefined1 local_48 [8];
  Iterator __iter;
  
  local_48 = (undefined1  [8])
             (((scriptContext->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.
             ptr;
  __iter.list = (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)local_48;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  addr = &__iter.current;
  do {
    if (__iter.list == (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_00974f1e;
      *puVar5 = 0;
    }
    auVar3 = local_48;
    pSVar1 = ((__iter.list)->super_SListNodeBase<Memory::Recycler>).next.ptr;
    Memory::Recycler::WBSetBit((char *)addr);
    __iter.current = pSVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    if ((undefined1  [8])__iter.current == auVar3) {
      return;
    }
    pSVar1 = ((__iter.list)->super_SListNodeBase<Memory::Recycler>).next.ptr;
    Memory::Recycler::WBSetBit((char *)addr);
    __iter.current = pSVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    __iter.list = (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)__iter.current
    ;
    pTVar6 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Iterator::Data
                       ((Iterator *)local_48);
    this_00 = GetFunctionBody(pTVar6->ptr);
    pSVar7 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this_00);
    this = (pSVar7->sourceDynamicProfileManager).ptr;
    if ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) {
LAB_00974f1e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    SourceDynamicProfileManager::SaveDynamicProfileInfo
              (this,((this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
                    functionId,pTVar6->ptr);
  } while( true );
}

Assistant:

void DynamicProfileInfo::UpdateSourceDynamicProfileManagers(ScriptContext * scriptContext)
    {
        // We don't clear old dynamic data here, because if a function is inlined, it will never go through the
        // EnsureDynamicProfileThunk and thus not appear in the list. We would want to keep those data as well.
        // Just save/update the data from function that has execute.

        // That means that the data will never go away, probably not a good policy if this is cached for web page in WININET.

        DynamicProfileInfoList * profileInfoList = scriptContext->GetProfileInfoList();
        FOREACH_SLISTBASE_ENTRY(DynamicProfileInfo * const, info, profileInfoList)
        {
            FunctionBody * functionBody = info->GetFunctionBody();
            SourceDynamicProfileManager * sourceDynamicProfileManager = functionBody->GetSourceContextInfo()->sourceDynamicProfileManager;
            sourceDynamicProfileManager->SaveDynamicProfileInfo(functionBody->GetLocalFunctionId(), info);
        }
        NEXT_SLISTBASE_ENTRY
    }